

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O3

void __thiscall
Assimp::AssbinImporter::ReadBinaryNodeAnim(AssbinImporter *this,IOStream *stream,aiNodeAnim *nd)

{
  undefined8 *puVar1;
  uint uVar2;
  aiAnimBehaviour aVar3;
  aiQuatKey *out;
  aiVectorKey *paVar4;
  runtime_error *this_00;
  ulong uVar5;
  aiQuatKey *paVar6;
  ulong uVar7;
  aiString local_438;
  
  uVar2 = Read<unsigned_int>(stream);
  if (uVar2 == 0x1238) {
    Read<unsigned_int>(stream);
    Read<aiString>(&local_438,stream);
    if ((aiNodeAnim *)&local_438 != nd) {
      (nd->mNodeName).length = local_438.length;
      memcpy((nd->mNodeName).data,(void *)((long)&local_438 + 4),local_438._0_8_ & 0xffffffff);
      (nd->mNodeName).data[local_438._0_8_ & 0xffffffff] = '\0';
    }
    uVar2 = Read<unsigned_int>(stream);
    nd->mNumPositionKeys = uVar2;
    uVar2 = Read<unsigned_int>(stream);
    nd->mNumRotationKeys = uVar2;
    uVar2 = Read<unsigned_int>(stream);
    nd->mNumScalingKeys = uVar2;
    aVar3 = Read<unsigned_int>(stream);
    nd->mPreState = aVar3;
    aVar3 = Read<unsigned_int>(stream);
    nd->mPostState = aVar3;
    uVar2 = nd->mNumPositionKeys;
    if ((ulong)uVar2 != 0) {
      uVar7 = (ulong)uVar2 * 0x18;
      if (this->shortened == true) {
        (*stream->_vptr_IOStream[4])(stream,uVar7,1);
      }
      else {
        paVar4 = (aiVectorKey *)operator_new__(uVar7);
        uVar5 = 0;
        do {
          puVar1 = (undefined8 *)((long)&paVar4->mTime + uVar5);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)&(paVar4->mValue).z + uVar5) = 0;
          uVar5 = uVar5 + 0x18;
        } while (uVar7 != uVar5);
        nd->mPositionKeys = paVar4;
        ReadArray<aiVectorKey>(stream,paVar4,uVar2);
      }
    }
    uVar2 = nd->mNumRotationKeys;
    uVar7 = (ulong)uVar2;
    if (uVar7 != 0) {
      if (this->shortened == true) {
        (*stream->_vptr_IOStream[4])(stream,uVar7 * 0x18,1);
      }
      else {
        out = (aiQuatKey *)operator_new__(uVar7 * 0x18);
        paVar6 = out;
        do {
          paVar6->mTime = 0.0;
          (paVar6->mValue).w = 1.0;
          (paVar6->mValue).x = 0.0;
          (paVar6->mValue).y = 0.0;
          (paVar6->mValue).z = 0.0;
          paVar6 = paVar6 + 1;
        } while (paVar6 != out + uVar7);
        nd->mRotationKeys = out;
        ReadArray<aiQuatKey>(stream,out,uVar2);
      }
    }
    uVar2 = nd->mNumScalingKeys;
    if ((ulong)uVar2 != 0) {
      uVar7 = (ulong)uVar2 * 0x18;
      if (this->shortened == true) {
        (*stream->_vptr_IOStream[4])(stream,uVar7,1);
      }
      else {
        paVar4 = (aiVectorKey *)operator_new__(uVar7);
        uVar5 = 0;
        do {
          puVar1 = (undefined8 *)((long)&paVar4->mTime + uVar5);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)&(paVar4->mValue).z + uVar5) = 0;
          uVar5 = uVar5 + 0x18;
        } while (uVar7 != uVar5);
        nd->mScalingKeys = paVar4;
        ReadArray<aiVectorKey>(stream,paVar4,uVar2);
      }
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_438._0_8_ = local_438.data + 0xc;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_438,"Magic chunk identifiers are wrong!","");
  std::runtime_error::runtime_error(this_00,(string *)&local_438);
  *(undefined ***)this_00 = &PTR__runtime_error_0080bf48;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AssbinImporter::ReadBinaryNodeAnim(IOStream * stream, aiNodeAnim* nd) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AINODEANIM)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    nd->mNodeName = Read<aiString>(stream);
    nd->mNumPositionKeys = Read<unsigned int>(stream);
    nd->mNumRotationKeys = Read<unsigned int>(stream);
    nd->mNumScalingKeys = Read<unsigned int>(stream);
    nd->mPreState = (aiAnimBehaviour)Read<unsigned int>(stream);
    nd->mPostState = (aiAnimBehaviour)Read<unsigned int>(stream);

    if (nd->mNumPositionKeys) {
        if (shortened) {
            ReadBounds(stream,nd->mPositionKeys,nd->mNumPositionKeys);

        } // else write as usual
        else {
            nd->mPositionKeys = new aiVectorKey[nd->mNumPositionKeys];
            ReadArray<aiVectorKey>(stream,nd->mPositionKeys,nd->mNumPositionKeys);
        }
    }
    if (nd->mNumRotationKeys) {
        if (shortened) {
            ReadBounds(stream,nd->mRotationKeys,nd->mNumRotationKeys);

        }  else {
            // else write as usual
            nd->mRotationKeys = new aiQuatKey[nd->mNumRotationKeys];
            ReadArray<aiQuatKey>(stream,nd->mRotationKeys,nd->mNumRotationKeys);
        }
    }
    if (nd->mNumScalingKeys) {
        if (shortened) {
            ReadBounds(stream,nd->mScalingKeys,nd->mNumScalingKeys);

        }  else {
            // else write as usual
            nd->mScalingKeys = new aiVectorKey[nd->mNumScalingKeys];
            ReadArray<aiVectorKey>(stream,nd->mScalingKeys,nd->mNumScalingKeys);
        }
    }
}